

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O1

int dice_evaluate(dice_t *dice,int level,aspect asp,random_value *v)

{
  random_value v_00;
  int iVar1;
  random_value rv;
  random_value local_28;
  
  dice_random_value(dice,&local_28);
  if (v != (random_value *)0x0) {
    v->base = local_28.base;
    v->dice = local_28.dice;
    v->sides = local_28.sides;
    v->m_bonus = local_28.m_bonus;
  }
  v_00.dice = local_28.dice;
  v_00.base = local_28.base;
  v_00.sides = local_28.sides;
  v_00.m_bonus = local_28.m_bonus;
  iVar1 = randcalc(v_00,level,asp);
  return iVar1;
}

Assistant:

int dice_evaluate(const dice_t *dice, int level, aspect asp, random_value *v)
{
	random_value rv;
	dice_random_value(dice, &rv);

	if (v != NULL) {
		v->base = rv.base;
		v->dice = rv.dice;
		v->sides = rv.sides;
		v->m_bonus = rv.m_bonus;
	}

	return randcalc(rv, level, asp);
}